

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O0

vss * Search::generalSearch
                (vss *__return_storage_ptr__,Problem *problem,int iterationLimit,int fringeSize,
                bool isRandomInitialize,int expanderCode,int completenessCode)

{
  ostream *poVar1;
  vector<State,_std::allocator<State>_> local_1d0;
  vector<State,_std::allocator<State>_> local_1b8;
  vector<State,_std::allocator<State>_> local_1a0;
  vector<State,_std::allocator<State>_> local_188;
  byte local_169;
  undefined1 local_168 [7];
  bool isComplete;
  vector<State,_std::allocator<State>_> local_150;
  byte local_135;
  int local_134;
  undefined1 local_130 [3];
  bool run;
  int iterationCount;
  State randomState_1;
  undefined1 local_100 [4];
  int i_1;
  State local_d8;
  string local_b0;
  undefined1 local_90 [8];
  State randomState;
  int i;
  undefined1 local_58 [8];
  vector<State,_std::allocator<State>_> newfringe;
  vector<State,_std::allocator<State>_> fringe;
  int expanderCode_local;
  bool isRandomInitialize_local;
  int fringeSize_local;
  int iterationLimit_local;
  Problem *problem_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Entered general search");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<State,_std::allocator<State>_>::vector
            ((vector<State,_std::allocator<State>_> *)
             &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<State,_std::allocator<State>_>::vector
            ((vector<State,_std::allocator<State>_> *)local_58);
  Problem::clearValidStore(problem);
  if (isRandomInitialize) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Random initialization");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (randomState.numConflicts = 0; randomState.numConflicts < fringeSize;
        randomState.numConflicts = randomState.numConflicts + 1) {
      Problem::generateRandomState((State *)local_90,problem);
      poVar1 = std::operator<<((ostream *)&std::cout,"State: ");
      State::State(&local_d8,(State *)local_90);
      Problem::getStringFromState_abi_cxx11_(&local_b0,problem,&local_d8);
      poVar1 = std::operator<<(poVar1,(string *)&local_b0);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_b0);
      State::~State(&local_d8);
      std::vector<State,_std::allocator<State>_>::push_back
                ((vector<State,_std::allocator<State>_> *)
                 &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)local_90);
      State::~State((State *)local_90);
    }
  }
  else {
    Problem::getInitialState((State *)local_100,problem);
    std::vector<State,_std::allocator<State>_>::push_back
              ((vector<State,_std::allocator<State>_> *)
               &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)local_100);
    State::~State((State *)local_100);
    for (randomState_1._36_4_ = 0; (int)randomState_1._36_4_ < fringeSize + -1;
        randomState_1._36_4_ = randomState_1._36_4_ + 1) {
      Problem::generateRandomState((State *)local_130,problem);
      std::vector<State,_std::allocator<State>_>::push_back
                ((vector<State,_std::allocator<State>_> *)
                 &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)local_130);
      State::~State((State *)local_130);
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Initialized fringe");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_134 = 0;
  local_135 = 1;
  do {
    if ((local_135 & 1) == 0) {
LAB_0010ca20:
      Problem::getValidStore(__return_storage_ptr__,problem);
      std::vector<State,_std::allocator<State>_>::~vector
                ((vector<State,_std::allocator<State>_> *)local_58);
      std::vector<State,_std::allocator<State>_>::~vector
                ((vector<State,_std::allocator<State>_> *)
                 &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    std::vector<State,_std::allocator<State>_>::vector
              ((vector<State,_std::allocator<State>_> *)local_168,
               (vector<State,_std::allocator<State>_> *)
               &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    Problem::fringeExpander
              (&local_150,problem,(vector<State,_std::allocator<State>_> *)local_168,fringeSize,0);
    std::vector<State,_std::allocator<State>_>::operator=
              ((vector<State,_std::allocator<State>_> *)local_58,&local_150);
    std::vector<State,_std::allocator<State>_>::~vector(&local_150);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)local_168);
    poVar1 = std::operator<<((ostream *)&std::cout,"Computed new fringe");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if (iterationLimit <= local_134) {
      local_135 = 0;
      poVar1 = std::operator<<((ostream *)&std::cout,"Exceeded max iterations");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      goto LAB_0010ca20;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Iteration: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_134);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if (completenessCode == 0) {
      std::vector<State,_std::allocator<State>_>::vector
                (&local_188,
                 (vector<State,_std::allocator<State>_> *)
                 &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<State,_std::allocator<State>_>::vector
                (&local_1a0,(vector<State,_std::allocator<State>_> *)local_58);
      local_169 = isCompleteLocalMaximum(&local_188,&local_1a0);
      std::vector<State,_std::allocator<State>_>::~vector(&local_1a0);
      std::vector<State,_std::allocator<State>_>::~vector(&local_188);
    }
    else {
      std::vector<State,_std::allocator<State>_>::vector
                (&local_1b8,
                 (vector<State,_std::allocator<State>_> *)
                 &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<State,_std::allocator<State>_>::vector
                (&local_1d0,(vector<State,_std::allocator<State>_> *)local_58);
      local_169 = isCompleteLocalMaximum(&local_1b8,&local_1d0);
      std::vector<State,_std::allocator<State>_>::~vector(&local_1d0);
      std::vector<State,_std::allocator<State>_>::~vector(&local_1b8);
    }
    if ((local_169 & 1) != 0) {
      local_135 = 0;
      poVar1 = std::operator<<((ostream *)&std::cout,"Reached Local maxima");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      goto LAB_0010ca20;
    }
    std::vector<State,_std::allocator<State>_>::operator=
              ((vector<State,_std::allocator<State>_> *)
               &newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<State,_std::allocator<State>_> *)local_58);
    local_134 = local_134 + 1;
  } while( true );
}

Assistant:

vss Search::generalSearch(Problem *problem, int iterationLimit, int fringeSize, bool isRandomInitialize,
                          int expanderCode, int completenessCode) {
    cout<<"Entered general search"<<endl;
    vector<State> fringe;
    vector<State> newfringe;
    problem->clearValidStore();

    // Initialize fringe
    if (isRandomInitialize) {
        cout<<"Random initialization"<<endl;
        for (int i = 0; i < fringeSize; ++i) {
            State randomState = problem->generateRandomState();
            cout<<"State: "<<problem->getStringFromState(randomState)<<endl;
            fringe.push_back(randomState);
        }
    }
    else {
        fringe.push_back(problem->getInitialState());
        for (int i = 0; i < fringeSize - 1; ++i) {
            State randomState = problem->generateRandomState();
            fringe.push_back(randomState);
        }
    }
    cout<<"Initialized fringe"<<endl;

    int iterationCount = 0;
    bool run = true;

    while (run) {
        newfringe = problem->fringeExpander(fringe, fringeSize, 0);
        cout<<"Computed new fringe"<<endl;

        // Check if search is complete
        if (iterationCount >= iterationLimit) {
            run = false;
            cout << "Exceeded max iterations" << endl;
            break;
        }

        cout<<"Iteration: "<<iterationCount<<endl;
        // cout<<"Best state: "<<problem->getStringFromState(newfringe[0])<<endl;

        bool isComplete;

        /*
         * Codes for completeness checking functions
         * 0 : terminate if local maximum found
         */
        switch (completenessCode) {
            case 0:
                isComplete = isCompleteLocalMaximum(fringe, newfringe);
                break;
            default:
                isComplete = isCompleteLocalMaximum(fringe, newfringe);
        }
        if (isComplete) {
            run = false;
            cout << "Reached Local maxima" << endl;
            break;
        }

        fringe = newfringe;
        iterationCount++;
    }

    return problem->getValidStore();

}